

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteFunc(WatWriter *this,Func *func)

{
  Index IVar1;
  pointer types;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  LabelType local_40 [4];
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  Func *func_local;
  WatWriter *this_local;
  
  index_to_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &func->name;
  WriteBeginFunc(this,func);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  IVar1 = Func::GetNumParamsAndLocals
                    ((Func *)index_to_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  MakeTypeBindingReverseMapping
            ((ulong)IVar1,
             (BindingHash *)
             ((long)&index_to_name.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[5].field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  (anonymous_namespace)::WatWriter::
  WriteTypeBindings<std::vector<wabt::Type,std::allocator<wabt::Type>>>
            ((WatWriter *)this,"param",
             (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
             &index_to_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[3].field_2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,0);
  WriteTypes(this,(TypeVector *)
                  &index_to_name.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_string_length,"result");
  WriteNewline(this,false);
  IVar1 = LocalTypes::size((LocalTypes *)
                           (index_to_name.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  if (IVar1 != 0) {
    types = index_to_name.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage + 5;
    IVar1 = Func::GetNumParams((Func *)index_to_name.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    WriteTypeBindings<wabt::LocalTypes>
              (this,"local",(LocalTypes *)types,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30,IVar1);
  }
  WriteNewline(this,false);
  std::
  vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>::
  clear(&this->label_stack_);
  local_40[0] = First;
  std::__cxx11::string::string((string *)&local_60);
  local_78.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_78);
  std::vector<wabt::(anonymous_namespace)::Label,std::allocator<wabt::(anonymous_namespace)::Label>>
  ::
  emplace_back<wabt::LabelType,std::__cxx11::string,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>const&>
            ((vector<wabt::(anonymous_namespace)::Label,std::allocator<wabt::(anonymous_namespace)::Label>>
              *)&this->label_stack_,local_40,&local_60,&local_78,
             (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
             &index_to_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_string_length);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_78);
  std::__cxx11::string::~string((string *)&local_60);
  this->current_func_ =
       (Func *)index_to_name.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((this->options_->fold_exprs & 1U) == 0) {
    WriteExprList(this,(ExprList *)
                       &index_to_name.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[7].field_2);
  }
  else {
    WriteFoldedExprList(this,(ExprList *)
                             &index_to_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage[7].field_2);
    FlushExprTreeStack(this);
  }
  this->current_func_ = (Func *)0x0;
  WriteCloseNewline(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

void WatWriter::WriteFunc(const Func& func) {
  WriteBeginFunc(func);
  std::vector<std::string> index_to_name;
  MakeTypeBindingReverseMapping(func.GetNumParamsAndLocals(), func.bindings,
                                &index_to_name);
  WriteTypeBindings("param", func.decl.sig.param_types, index_to_name);
  WriteTypes(func.decl.sig.result_types, "result");
  WriteNewline(NO_FORCE_NEWLINE);
  if (func.local_types.size()) {
    WriteTypeBindings("local", func.local_types, index_to_name,
                      func.GetNumParams());
  }
  WriteNewline(NO_FORCE_NEWLINE);
  label_stack_.clear();
  label_stack_.emplace_back(LabelType::Func, std::string(), TypeVector(),
                            func.decl.sig.result_types);
  current_func_ = &func;
  if (options_.fold_exprs) {
    WriteFoldedExprList(func.exprs);
    FlushExprTreeStack();
  } else {
    WriteExprList(func.exprs);
  }
  current_func_ = nullptr;
  WriteCloseNewline();
}